

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

VerifySignResponseStruct * __thiscall
cfd::js::api::json::VerifySignResponse::ConvertToStruct
          (VerifySignResponseStruct *__return_storage_ptr__,VerifySignResponse *this)

{
  vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  local_38;
  undefined1 local_19;
  VerifySignResponse *local_18;
  VerifySignResponse *this_local;
  VerifySignResponseStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (VerifySignResponse *)__return_storage_ptr__;
  VerifySignResponseStruct::VerifySignResponseStruct(__return_storage_ptr__);
  __return_storage_ptr__->success = (bool)(this->success_ & 1);
  core::JsonObjectVector<cfd::js::api::json::FailSignTxIn,_cfd::js::api::FailSignTxInStruct>::
  ConvertToStruct(&local_38,&this->fail_txins_);
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  operator=(&__return_storage_ptr__->fail_txins,&local_38);
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  ~vector(&local_38);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

VerifySignResponseStruct VerifySignResponse::ConvertToStruct() const {  // NOLINT
  VerifySignResponseStruct result;
  result.success = success_;
  result.fail_txins = fail_txins_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}